

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O0

RequestBuilder * __thiscall restincurl::RequestBuilder::WithJson(RequestBuilder *this,string *body)

{
  RequestBuilder *pRVar1;
  string local_38 [32];
  string *local_18;
  string *body_local;
  RequestBuilder *this_local;
  
  local_18 = body;
  body_local = (string *)this;
  WithJson(this);
  std::__cxx11::string::string(local_38,(string *)body);
  pRVar1 = SendData<std::__cxx11::string>
                     (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_38);
  std::__cxx11::string::~string(local_38);
  return pRVar1;
}

Assistant:

RequestBuilder& WithJson(std::string body) {
            WithJson();
            return SendData(std::move(body));
        }